

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O1

int xmlThrDefLineNumbersDefaultValue(int v)

{
  int iVar1;
  
  xmlMutexLock(&xmlThrDefMutex);
  iVar1 = xmlLineNumbersDefaultValueThrDef;
  xmlLineNumbersDefaultValueThrDef = v;
  xmlMutexUnlock(&xmlThrDefMutex);
  return iVar1;
}

Assistant:

int xmlThrDefLineNumbersDefaultValue(int v) {
    int ret;
    xmlMutexLock(&xmlThrDefMutex);
    ret = xmlLineNumbersDefaultValueThrDef;
    xmlLineNumbersDefaultValueThrDef = v;
    xmlMutexUnlock(&xmlThrDefMutex);
    return ret;
}